

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuResultCollector.cpp
# Opt level: O1

void __thiscall
tcu::ResultCollector::addResult(ResultCollector *this,qpTestResult result,string *msg)

{
  ostringstream *this_00;
  int iVar1;
  int iVar2;
  undefined1 local_1a0 [384];
  
  if (this->m_log != (TestLog *)0x0) {
    this_00 = (ostringstream *)(local_1a0 + 8);
    local_1a0._0_8_ = this->m_log;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,(this->m_prefix)._M_dataplus._M_p,
               (this->m_prefix)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,(msg->_M_dataplus)._M_p,msg->_M_string_length);
    MessageBuilder::operator<<((MessageBuilder *)local_1a0,(EndMessageToken *)&TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x78));
  }
  iVar1 = 0;
  iVar2 = 0;
  if (result < (QP_TEST_RESULT_LAST|QP_TEST_RESULT_FAIL)) {
    iVar2 = *(int *)(&DAT_0037ca94 + (ulong)result * 4);
  }
  if ((ulong)this->m_result < 0xb) {
    iVar1 = *(int *)(&DAT_0037ca94 + (ulong)this->m_result * 4);
  }
  if (iVar1 < iVar2) {
    this->m_result = result;
    std::__cxx11::string::_M_assign((string *)&this->m_message);
  }
  return;
}

Assistant:

void ResultCollector::addResult (qpTestResult result, const std::string& msg)
{
	if (m_log != DE_NULL)
		(*m_log) << TestLog::Message << m_prefix << msg << TestLog::EndMessage;

	if (testResultSeverity(result) > testResultSeverity(m_result))
	{
		m_result = result;
		m_message = msg;
	}
}